

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O1

string * __thiscall
testing::internal::FormatFileLocation_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char *file,int line)

{
  size_type *psVar1;
  undefined8 *puVar2;
  long lVar3;
  size_t sVar4;
  undefined8 *puVar5;
  long *plVar6;
  size_type *psVar7;
  pointer pcVar8;
  undefined8 uVar9;
  size_type *local_b0;
  string file_name;
  long local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  size_type *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined8 local_40;
  undefined8 uStack_38;
  int local_2c [2];
  int line_local;
  
  local_2c[0] = (int)file;
  if (this == (internal *)0x0) {
    this = (internal *)"unknown file";
  }
  local_b0 = &file_name._M_string_length;
  sVar4 = strlen((char *)this);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,this,this + sVar4);
  if (local_2c[0] < 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_b0,file_name._M_dataplus._M_p + (long)local_b0
              );
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    goto LAB_001258be;
  }
  psVar1 = &__str._M_string_length;
  local_70 = psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,local_b0,file_name._M_dataplus._M_p + (long)local_b0);
  std::__cxx11::string::append((char *)&local_70);
  StreamableToString<int>((string *)((long)&file_name.field_2 + 8),local_2c);
  pcVar8 = (pointer)0xf;
  if (local_70 != psVar1) {
    pcVar8 = (pointer)__str._M_string_length;
  }
  if (pcVar8 < __str._M_dataplus._M_p + local_88) {
    uVar9 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)file_name.field_2._8_8_ != &local_80) {
      uVar9 = local_80._M_allocated_capacity;
    }
    if ((ulong)uVar9 < __str._M_dataplus._M_p + local_88) goto LAB_001257a4;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)((long)&file_name.field_2 + 8),0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_001257a4:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_70,file_name.field_2._8_8_);
  }
  __str.field_2._8_8_ = &local_40;
  puVar2 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar2) {
    local_40 = *puVar2;
    uStack_38 = puVar5[3];
  }
  else {
    local_40 = *puVar2;
    __str.field_2._8_8_ = (undefined8 *)*puVar5;
  }
  *puVar5 = puVar2;
  puVar5[1] = 0;
  *(undefined1 *)puVar2 = 0;
  plVar6 = (long *)std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar7 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar7) {
    lVar3 = plVar6[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
  }
  __return_storage_ptr__->_M_string_length = plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((undefined8 *)__str.field_2._8_8_ != &local_40) {
    operator_delete((void *)__str.field_2._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)file_name.field_2._8_8_ != &local_80) {
    operator_delete((void *)file_name.field_2._8_8_);
  }
  if (local_70 != psVar1) {
    operator_delete(local_70);
  }
LAB_001258be:
  if (local_b0 != &file_name._M_string_length) {
    operator_delete(local_b0);
  }
  return __return_storage_ptr__;
}

Assistant:

GTEST_API_ ::std::string FormatFileLocation(const char* file, int line) {
  const std::string file_name(file == NULL ? kUnknownFile : file);

  if (line < 0) {
    return file_name + ":";
  }
#ifdef _MSC_VER
  return file_name + "(" + StreamableToString(line) + "):";
#else
  return file_name + ":" + StreamableToString(line) + ":";
#endif  // _MSC_VER
}